

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.hpp
# Opt level: O2

void __thiscall gl4cts::GPUShaderFP64Test3::~GPUShaderFP64Test3(GPUShaderFP64Test3 *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GPUShaderFP64Test3_01dccb00;
  std::
  _Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  ::~_Vector_base(&(this->m_uniform_details).
                   super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
                 );
  programInfo::~programInfo(&this->m_std140_program);
  programInfo::~programInfo(&this->m_shared_program);
  programInfo::~programInfo(&this->m_packed_program);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

virtual ~GPUShaderFP64Test3()
	{
	}